

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn.cpp
# Opt level: O2

vec8 * asn1::mkINT(vec8 *__return_storage_ptr__,uint64_t val)

{
  pointer puVar1;
  long lVar2;
  uint8_t local_22;
  uint8_t temp [8];
  
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pushHead(__return_storage_ptr__,'\x02',0);
  if (val == 0) {
    temp[0] = '\0';
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (__return_storage_ptr__,temp);
  }
  else {
    lVar2 = 0;
    for (; val != 0; val = val >> 8) {
      temp[lVar2 + -1] = (uint8_t)val;
      lVar2 = lVar2 + -1;
    }
    for (; lVar2 != 0; lVar2 = lVar2 + 1) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                (__return_storage_ptr__,temp + lVar2);
    }
  }
  puVar1 = (__return_storage_ptr__->
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar1[1] = ((char)*(undefined4 *)
                      &(__return_storage_ptr__->
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                       super__Vector_impl_data._M_finish - (char)puVar1) + 0xfe;
  return __return_storage_ptr__;
}

Assistant:

vec8 mkINT(uint64_t val)
{
    vec8 out;
    uint8_t temp[8];
    pushHead(out, 0x2, 0);
    if (val == 0) {
        out.push_back(0);
    } else {
        int i = 8;
        while (val) {
            temp[--i] = (val & 0xff);
            val >>= 8;
        }
        for (; i < 8; i++)
            out.push_back(temp[i]);
    }

    out[1] = (uint8_t)out.size() - 2;

    return out;
}